

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte *pbVar1;
  int iVar2;
  float fVar3;
  int iVar4;
  float fVar5;
  byte bVar6;
  undefined8 uVar7;
  byte bVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  ImFont *pIVar12;
  byte bVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  byte *extraout_RDX;
  byte *pbVar17;
  byte *__dest;
  byte *in_R9;
  byte *pbVar18;
  byte *pbVar19;
  byte *pbVar20;
  byte *pbVar21;
  uint uVar22;
  undefined2 local_130;
  undefined1 local_12e;
  undefined2 local_12c;
  undefined1 local_12a;
  undefined3 local_118;
  undefined5 uStack_115;
  undefined3 uStack_110;
  float fStack_10d;
  float fStack_109;
  char local_e8 [48];
  ImFontConfig local_b8;
  
  uVar15 = *(uint *)((long)compressed_ttf_data + 8);
  uVar22 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
  pbVar9 = (byte *)ImGui::MemAlloc((ulong)uVar22);
  local_b8._52_4_ = SUB84(in_R9,0);
  uVar15 = *compressed_ttf_data;
  pbVar17 = extraout_RDX;
  if (((uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18) ==
       0x57bc0000) &&
     (uVar15 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar15 >> 0x18 == 0 && (uVar15 & 0xff0000) == 0) && (uVar15 & 0xff00) == 0) &&
     (uVar15 & 0xff) == 0)) {
    uVar15 = *(uint *)((long)compressed_ttf_data + 8);
    uVar11 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                    uVar15 << 0x18);
    pbVar1 = pbVar9 + uVar11;
    pbVar18 = pbVar9 + uVar11 + 1;
    __dest = pbVar9;
    pbVar20 = (byte *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e = pbVar1;
    stb__barrier_out_b = pbVar9;
    stb__dout = pbVar9;
    do {
      local_b8._52_4_ = SUB84(in_R9,0);
      bVar8 = *pbVar20;
      uVar15 = (uint)bVar8;
      if (bVar8 < 0x20) {
        if (bVar8 < 0x18) {
          if (bVar8 < 0x10) {
            if (bVar8 < 8) {
              if (bVar8 == 4) {
                uVar14 = *(ushort *)(pbVar20 + 4) << 8 | *(ushort *)(pbVar20 + 4) >> 8;
                stb__dout = __dest + (ulong)uVar14 + 1;
                if (__dest + (ulong)uVar14 + 1 <= pbVar1) {
                  bVar8 = pbVar20[1];
                  pbVar17 = (byte *)((ulong)bVar8 * 0x10000);
                  bVar13 = pbVar20[2];
                  bVar6 = pbVar20[3];
                  in_R9 = __dest + ~((ulong)(pbVar17 + bVar6) | (ulong)bVar13 * 0x100);
                  stb__dout = pbVar18;
                  if (pbVar9 <= in_R9) {
                    iVar2 = uVar14 + 1;
                    do {
                      stb__dout = __dest + 1;
                      pbVar17 = (byte *)(ulong)__dest[~((ulong)bVar6 + (ulong)bVar13 * 0x100) +
                                                      (ulong)bVar8 * -0x10000];
                      *__dest = __dest[~((ulong)bVar6 + (ulong)bVar13 * 0x100) +
                                       (ulong)bVar8 * -0x10000];
                      iVar2 = iVar2 + -1;
                      __dest = stb__dout;
                    } while (iVar2 != 0);
                  }
                }
                pbVar21 = pbVar20 + 6;
                __dest = stb__dout;
              }
              else {
                if (uVar15 != 6) {
                  if (uVar15 == 7) {
                    pbVar17 = (byte *)(ulong)(ushort)(*(ushort *)(pbVar20 + 1) << 8 |
                                                     *(ushort *)(pbVar20 + 1) >> 8);
                    pbVar19 = __dest + (long)pbVar17 + 1;
                    pbVar21 = pbVar19;
                    if ((pbVar19 <= pbVar1) &&
                       (pbVar21 = pbVar18, compressed_ttf_data <= pbVar20 + 3)) {
                      memcpy(__dest,pbVar20 + 3,(size_t)(pbVar17 + 1));
                      pbVar17 = (byte *)(ulong)(ushort)(*(ushort *)(pbVar20 + 1) << 8 |
                                                       *(ushort *)(pbVar20 + 1) >> 8);
                      pbVar21 = pbVar19;
                    }
                    lVar10 = 4;
                    stb__dout = pbVar21;
                    goto LAB_00176a88;
                  }
                  break;
                }
                stb__dout = __dest + (ulong)pbVar20[4] + 1;
                if (__dest + (ulong)pbVar20[4] + 1 <= pbVar1) {
                  bVar8 = pbVar20[1];
                  pbVar17 = (byte *)((ulong)bVar8 * 0x10000);
                  bVar13 = pbVar20[2];
                  bVar6 = pbVar20[3];
                  in_R9 = __dest + ~((ulong)(pbVar17 + bVar6) | (ulong)bVar13 * 0x100);
                  stb__dout = pbVar18;
                  if (pbVar9 <= in_R9) {
                    uVar11 = (ulong)pbVar20[4] + 1;
                    do {
                      stb__dout = __dest + 1;
                      pbVar17 = (byte *)(ulong)__dest[~((ulong)bVar6 + (ulong)bVar13 * 0x100) +
                                                      (ulong)bVar8 * -0x10000];
                      *__dest = __dest[~((ulong)bVar6 + (ulong)bVar13 * 0x100) +
                                       (ulong)bVar8 * -0x10000];
                      uVar15 = (int)uVar11 - 1;
                      uVar11 = (ulong)uVar15;
                      __dest = stb__dout;
                    } while (uVar15 != 0);
                  }
                }
                pbVar21 = pbVar20 + 5;
                __dest = stb__dout;
              }
            }
            else {
              bVar13 = pbVar20[1];
              uVar11 = (ulong)((uVar15 * 0x100 + (uint)bVar13) - 0x7ff);
              pbVar17 = __dest + uVar11;
              pbVar21 = pbVar17;
              if ((pbVar17 <= pbVar1) && (pbVar21 = pbVar18, compressed_ttf_data <= pbVar20 + 2)) {
                memcpy(__dest,pbVar20 + 2,uVar11);
                bVar8 = *pbVar20;
                bVar13 = pbVar20[1];
                pbVar21 = pbVar17;
              }
              pbVar17 = (byte *)(ulong)CONCAT11(bVar8,bVar13);
              lVar10 = -0x7fd;
              stb__dout = pbVar21;
LAB_00176a88:
              local_b8._52_4_ = SUB84(in_R9,0);
              pbVar21 = pbVar20 + lVar10 + (long)pbVar17;
              __dest = stb__dout;
              if (pbVar21 == pbVar20) break;
            }
          }
          else {
            uVar14 = *(ushort *)(pbVar20 + 3) << 8 | *(ushort *)(pbVar20 + 3) >> 8;
            pbVar17 = __dest + (ulong)uVar14 + 1;
            if ((__dest + (ulong)uVar14 + 1 <= pbVar1) &&
               (uVar11 = (ulong)(((uint)pbVar20[1] * 0x100 +
                                 ((uint)pbVar20[2] | (uint)bVar8 << 0x10)) - 0xfffff),
               pbVar17 = pbVar18, pbVar9 <= __dest + -uVar11)) {
              iVar2 = uVar14 + 1;
              do {
                pbVar17 = __dest + 1;
                *__dest = __dest[-uVar11];
                iVar2 = iVar2 + -1;
                __dest = pbVar17;
              } while (iVar2 != 0);
            }
            pbVar21 = pbVar20 + 5;
            __dest = pbVar17;
            stb__dout = pbVar17;
          }
        }
        else {
          pbVar17 = __dest + (ulong)pbVar20[3] + 1;
          if ((__dest + (ulong)pbVar20[3] + 1 <= pbVar1) &&
             (uVar11 = (ulong)(((uint)pbVar20[1] * 0x100 + ((uint)pbVar20[2] | (uint)bVar8 << 0x10))
                              - 0x17ffff), pbVar17 = pbVar18, pbVar9 <= __dest + -uVar11)) {
            uVar16 = (ulong)pbVar20[3] + 1;
            do {
              pbVar17 = __dest + 1;
              *__dest = __dest[-uVar11];
              uVar15 = (int)uVar16 - 1;
              uVar16 = (ulong)uVar15;
              __dest = pbVar17;
            } while (uVar15 != 0);
          }
          pbVar21 = pbVar20 + 4;
          __dest = pbVar17;
          stb__dout = pbVar17;
        }
      }
      else if ((char)bVar8 < '\0') {
        uVar15 = uVar15 - 0x7f;
        uVar11 = (ulong)uVar15;
        pbVar17 = __dest + uVar11;
        pbVar19 = pbVar17;
        pbVar21 = pbVar17;
        if ((pbVar17 <= pbVar1) &&
           (bVar8 = pbVar20[1], pbVar17 = pbVar18, pbVar19 = pbVar18, pbVar21 = pbVar18,
           pbVar9 <= __dest + ~(ulong)bVar8)) {
          while (pbVar19 = __dest, pbVar21 = stb__dout, uVar15 != 0) {
            stb__dout = __dest + 1;
            *__dest = __dest[~(ulong)bVar8];
            uVar15 = (int)uVar11 - 1;
            uVar11 = (ulong)uVar15;
            pbVar17 = stb__dout;
            __dest = stb__dout;
          }
        }
        stb__dout = pbVar21;
        pbVar21 = pbVar20 + 2;
        __dest = pbVar19;
      }
      else {
        if (bVar8 < 0x40) {
          pbVar17 = __dest + (uVar15 - 0x1f);
          pbVar21 = pbVar17;
          if ((pbVar17 <= pbVar1) && (pbVar21 = pbVar18, compressed_ttf_data <= pbVar20 + 1)) {
            memcpy(__dest,pbVar20 + 1,(ulong)(uVar15 - 0x1f));
            bVar8 = *pbVar20;
            pbVar21 = pbVar17;
          }
          pbVar17 = (byte *)(ulong)bVar8;
          lVar10 = -0x1e;
          stb__dout = pbVar21;
          goto LAB_00176a88;
        }
        pbVar17 = __dest + (ulong)pbVar20[2] + 1;
        if ((__dest + (ulong)pbVar20[2] + 1 <= pbVar1) &&
           (uVar11 = (ulong)(((uint)bVar8 * 0x100 + (uint)pbVar20[1]) - 0x3fff), pbVar17 = pbVar18,
           pbVar9 <= __dest + -uVar11)) {
          uVar16 = (ulong)pbVar20[2] + 1;
          do {
            pbVar17 = __dest + 1;
            *__dest = __dest[-uVar11];
            uVar15 = (int)uVar16 - 1;
            uVar16 = (ulong)uVar15;
            __dest = pbVar17;
          } while (uVar15 != 0);
        }
        pbVar21 = pbVar20 + 3;
        __dest = pbVar17;
        stb__dout = pbVar17;
      }
      local_b8._52_4_ = SUB84(in_R9,0);
      pbVar20 = pbVar21;
    } while (__dest <= pbVar1);
  }
  local_b8._126_2_ = SUB82(pbVar17,0);
  if (font_cfg_template == (ImFontConfig *)0x0) {
    uStack_115 = 0;
    uStack_110 = 0;
    fStack_10d = 0.0;
    fStack_109 = 0.0;
    local_e8[0] = '\0';
    local_e8[1] = '\0';
    local_e8[2] = '\0';
    local_e8[3] = '\0';
    local_e8[4] = '\0';
    local_e8[5] = '\0';
    local_e8[6] = '\0';
    local_e8[7] = '\0';
    local_e8[8] = '\0';
    local_e8[9] = '\0';
    local_e8[10] = '\0';
    local_e8[0xb] = '\0';
    local_e8[0xc] = '\0';
    local_e8[0xd] = '\0';
    local_e8[0xe] = '\0';
    local_e8[0xf] = '\0';
    local_e8[0x10] = '\0';
    local_e8[0x11] = '\0';
    local_e8[0x12] = '\0';
    local_e8[0x13] = '\0';
    local_e8[0x14] = '\0';
    local_e8[0x15] = '\0';
    local_e8[0x16] = '\0';
    local_e8[0x17] = '\0';
    local_e8[0x18] = '\0';
    local_e8[0x19] = '\0';
    local_e8[0x1a] = '\0';
    local_e8[0x1b] = '\0';
    local_e8[0x1c] = '\0';
    local_e8[0x1d] = '\0';
    local_e8[0x1e] = '\0';
    local_e8[0x1f] = '\0';
    local_e8[0x20] = '\0';
    local_e8[0x21] = '\0';
    local_e8[0x22] = '\0';
    local_e8[0x23] = '\0';
    local_e8[0x24] = '\0';
    local_e8[0x25] = '\0';
    local_e8[0x26] = '\0';
    local_e8[0x27] = '\0';
    iVar2 = 3;
    iVar4 = 1;
    fVar3 = 0.0;
    fVar5 = 3.4028235e+38;
    local_b8.DstFont = (ImFont *)0x0;
    local_b8.RasterizerMultiply = 1.0;
    local_b8.EllipsisChar = 0xffff;
    local_b8.RasterizerFlags = 0;
    local_b8.MergeMode = false;
    local_b8.GlyphRanges = (ImWchar *)0x0;
    local_b8.PixelSnapH = false;
    local_b8.FontNo = 0;
  }
  else {
    local_12a = font_cfg_template->field_0xf;
    local_12c = *(undefined2 *)&font_cfg_template->field_0xd;
    local_b8.FontNo = font_cfg_template->FontNo;
    iVar2 = font_cfg_template->OversampleH;
    iVar4 = font_cfg_template->OversampleV;
    local_b8.PixelSnapH = font_cfg_template->PixelSnapH;
    uVar7 = *(undefined8 *)((long)&(font_cfg_template->GlyphExtraSpacing).y + 1);
    local_118 = (undefined3)*(undefined8 *)&font_cfg_template->field_0x21;
    uStack_115 = (undefined5)((ulong)*(undefined8 *)&font_cfg_template->field_0x21 >> 0x18);
    uStack_110 = (undefined3)uVar7;
    fStack_10d = (float)((ulong)uVar7 >> 0x18);
    fStack_109._1_3_ = (undefined3)((uint)(font_cfg_template->GlyphOffset).y >> 8);
    fStack_109._0_1_ = (undefined1)((ulong)uVar7 >> 0x38);
    local_b8._52_4_ = *(undefined4 *)&font_cfg_template->field_0x34;
    local_b8.GlyphRanges = font_cfg_template->GlyphRanges;
    fVar3 = font_cfg_template->GlyphMinAdvanceX;
    fVar5 = font_cfg_template->GlyphMaxAdvanceX;
    local_b8.MergeMode = font_cfg_template->MergeMode;
    local_12e = font_cfg_template->field_0x4b;
    local_130 = *(undefined2 *)&font_cfg_template->field_0x49;
    local_b8.RasterizerFlags = font_cfg_template->RasterizerFlags;
    local_b8.RasterizerMultiply = font_cfg_template->RasterizerMultiply;
    local_b8.EllipsisChar = font_cfg_template->EllipsisChar;
    local_e8._32_8_ = *(undefined8 *)(font_cfg_template->Name + 0x20);
    local_e8._16_8_ = *(undefined8 *)(font_cfg_template->Name + 0x10);
    local_e8._24_8_ = *(undefined8 *)(font_cfg_template->Name + 0x18);
    local_e8._0_8_ = *(undefined8 *)font_cfg_template->Name;
    local_e8._8_8_ = *(undefined8 *)(font_cfg_template->Name + 8);
    local_b8._126_2_ = *(undefined2 *)&font_cfg_template->field_0x7e;
    local_b8.DstFont = font_cfg_template->DstFont;
  }
  local_b8.FontDataOwnedByAtlas = true;
  local_b8._13_2_ = local_12c;
  local_b8._15_1_ = local_12a;
  local_b8.OversampleV = iVar4;
  local_b8.OversampleH = iVar2;
  local_b8.GlyphExtraSpacing._0_5_ = uStack_115;
  local_b8._33_3_ = local_118;
  local_b8.GlyphOffset.x = fStack_10d;
  local_b8.GlyphExtraSpacing.y._1_3_ = uStack_110;
  local_b8.GlyphOffset.y = fStack_109;
  local_b8.GlyphMaxAdvanceX = fVar5;
  local_b8.GlyphMinAdvanceX = fVar3;
  local_b8._73_2_ = local_130;
  local_b8._75_1_ = local_12e;
  local_b8.Name[0] = local_e8[0];
  local_b8.Name[1] = local_e8[1];
  local_b8.Name[2] = local_e8[2];
  local_b8.Name[3] = local_e8[3];
  local_b8.Name[4] = local_e8[4];
  local_b8.Name[5] = local_e8[5];
  local_b8.Name[6] = local_e8[6];
  local_b8.Name[7] = local_e8[7];
  local_b8.Name[8] = local_e8[8];
  local_b8.Name[9] = local_e8[9];
  local_b8.Name[10] = local_e8[10];
  local_b8.Name[0xb] = local_e8[0xb];
  local_b8.Name[0xc] = local_e8[0xc];
  local_b8.Name[0xd] = local_e8[0xd];
  local_b8.Name[0xe] = local_e8[0xe];
  local_b8.Name[0xf] = local_e8[0xf];
  local_b8.Name[0x10] = local_e8[0x10];
  local_b8.Name[0x11] = local_e8[0x11];
  local_b8.Name[0x12] = local_e8[0x12];
  local_b8.Name[0x13] = local_e8[0x13];
  local_b8.Name[0x14] = local_e8[0x14];
  local_b8.Name[0x15] = local_e8[0x15];
  local_b8.Name[0x16] = local_e8[0x16];
  local_b8.Name[0x17] = local_e8[0x17];
  local_b8.Name[0x18] = local_e8[0x18];
  local_b8.Name[0x19] = local_e8[0x19];
  local_b8.Name[0x1a] = local_e8[0x1a];
  local_b8.Name[0x1b] = local_e8[0x1b];
  local_b8.Name[0x1c] = local_e8[0x1c];
  local_b8.Name[0x1d] = local_e8[0x1d];
  local_b8.Name[0x1e] = local_e8[0x1e];
  local_b8.Name[0x1f] = local_e8[0x1f];
  local_b8.Name[0x20] = local_e8[0x20];
  local_b8.Name[0x21] = local_e8[0x21];
  local_b8.Name[0x22] = local_e8[0x22];
  local_b8.Name[0x23] = local_e8[0x23];
  local_b8.Name[0x24] = local_e8[0x24];
  local_b8.Name[0x25] = local_e8[0x25];
  local_b8.Name[0x26] = local_e8[0x26];
  local_b8.Name[0x27] = local_e8[0x27];
  if (glyph_ranges != (ImWchar *)0x0) {
    local_b8.GlyphRanges = glyph_ranges;
  }
  local_b8.FontData = pbVar9;
  local_b8.FontDataSize = uVar22;
  local_b8.SizePixels = size_pixels;
  pIVar12 = AddFont(this,&local_b8);
  return pIVar12;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}